

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decaf.c
# Opt level: O3

void decaf_448_point_dual_scalarmul
               (decaf_448_point_s *a1,decaf_448_point_s *a2,decaf_448_point_s *b,
               decaf_448_scalar_s *scalar1,decaf_448_scalar_s *scalar2)

{
  gf_448_s *b_00;
  decaf_448_point_s *p;
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  decaf_448_point_s *pdVar8;
  sbyte sVar9;
  ulong uVar10;
  ulong uVar11;
  uint32_t y_3;
  int iVar12;
  uint uVar13;
  uint32_t y_4;
  uint uVar14;
  decaf_448_point_s *p_00;
  long lVar15;
  uint32_t y;
  uint uVar16;
  uint uVar17;
  decaf_448_point_s *r;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  big_register_t br_mask;
  big_register_t big_i_1;
  uint uVar28;
  big_register_t big_i;
  uchar *bFalse;
  uint32_t y_1;
  gf_448_t y_2;
  decaf_448_scalar_t scalar2x;
  decaf_448_scalar_t scalar1x;
  pniels_t pn;
  decaf_448_point_t tmp;
  decaf_448_point_t working;
  decaf_448_point_t multiples2 [16];
  decaf_448_point_t multiples1 [16];
  undefined8 local_2470;
  gf_448_s local_2440;
  uint local_23f0;
  uint uStack_23ec;
  uint uStack_23e8;
  uint uStack_23e4;
  decaf_448_scalar_s local_23e0;
  decaf_448_scalar_s local_23a0;
  anon_struct_256_2_948a309a local_2360;
  decaf_448_point_s local_2260;
  decaf_448_point_s local_2160;
  decaf_448_point_s local_2060;
  decaf_448_point_s adStack_1f60 [14];
  decaf_448_point_s dStack_1160;
  decaf_448_point_s local_1060;
  decaf_448_point_s local_f60 [14];
  decaf_448_point_s local_160;
  
  decaf_448_scalar_add(&local_23a0,scalar1,point_scalarmul_adjustment);
  decaf_448_scalar_halve(&local_23a0,&local_23a0);
  decaf_448_scalar_add(&local_23e0,scalar2,point_scalarmul_adjustment);
  decaf_448_scalar_halve(&local_23e0,&local_23e0);
  memcpy(&local_2160,b,0x100);
  lVar15 = 0;
  do {
    memcpy((void *)((long)local_1060.x[0].limb + lVar15),decaf_448_point_identity,0x100);
    memcpy((void *)((long)local_2060.x[0].limb + lVar15),decaf_448_point_identity,0x100);
    lVar15 = lVar15 + 0x100;
  } while (lVar15 != 0x1000);
  b_00 = local_2360.n[0].c;
  uVar11 = 0;
  do {
    uVar14 = (uint)uVar11;
    if (uVar14 != 0) {
      iVar12 = 4;
      do {
        point_double_internal(&local_2160,&local_2160,-1);
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
      point_double_internal(&local_2160,&local_2160,0);
    }
    uVar11 = uVar11 >> 6;
    uVar10 = (ulong)(uint)((int)uVar11 * 8);
    sVar9 = (sbyte)(uVar14 & 0x3f);
    uVar16 = (uint)(*(ulong *)((long)local_23a0.limb + uVar10) >> sVar9);
    uVar13 = (uint)(*(ulong *)((long)local_23e0.limb + uVar10) >> sVar9);
    if (uVar14 < 0x180 && 0x3a < (uVar14 & 0x3f)) {
      uVar16 = uVar16 ^ (uint)(local_23a0.limb[uVar11 + 1] << (-sVar9 & 0x3fU));
      uVar13 = uVar13 ^ (uint)(local_23e0.limb[uVar11 + 1] << (-sVar9 & 0x3fU));
    }
    uVar7 = ((uVar16 >> 4 & 1) != 0) - 1;
    uVar16 = uVar16 ^ uVar7;
    pt_to_pniels(&local_2360,&local_2160);
    uVar17 = uVar16 & 0xf;
    uVar28 = uVar16 & 0xf;
    uVar16 = uVar16 & 0xf;
    memset(&local_2260,0,0x100);
    pdVar8 = &local_1060;
    lVar15 = 0;
    uVar18 = uVar28;
    uVar19 = uVar16;
    uVar20 = uVar17;
    uVar21 = uVar17;
    do {
      uVar11 = 0xfffffffffffffff0;
      do {
        puVar1 = (uint *)((long)pdVar8->x[0].limb + uVar11 + 0x10);
        uVar23 = puVar1[1];
        uVar25 = puVar1[2];
        uVar22 = puVar1[3];
        uVar3 = *(uint *)((long)local_2260.x[0].limb + uVar11 + 0x14);
        uVar4 = *(uint *)((long)local_2260.x[0].limb + uVar11 + 0x18);
        uVar5 = *(uint *)((long)local_2260.x[0].limb + uVar11 + 0x1c);
        *(uint *)((long)local_2260.x[0].limb + uVar11 + 0x10) =
             *puVar1 & -(uint)(uVar18 == 0) | *(uint *)((long)local_2260.x[0].limb + uVar11 + 0x10);
        *(uint *)((long)local_2260.x[0].limb + uVar11 + 0x14) =
             uVar23 & -(uint)(uVar19 == 0) | uVar3;
        *(uint *)((long)local_2260.x[0].limb + uVar11 + 0x18) =
             uVar25 & -(uint)(uVar20 == 0) | uVar4;
        *(uint *)((long)local_2260.x[0].limb + uVar11 + 0x1c) =
             uVar22 & -(uint)(uVar21 == 0) | uVar5;
        uVar11 = uVar11 + 0x10;
      } while (uVar11 < 0xe1);
      lVar15 = lVar15 + 1;
      uVar18 = uVar18 - 1;
      uVar19 = uVar19 - 1;
      uVar20 = uVar20 - 1;
      uVar21 = uVar21 - 1;
      pdVar8 = pdVar8 + 1;
    } while (lVar15 != 0x10);
    uVar18 = (uVar13 >> 4 & 1) - 1;
    uVar11 = 0xfffffffffffffff0;
    do {
      uVar4 = *(uint *)((long)local_2360.n[0].a[0].limb + uVar11 + 0x10);
      uVar5 = *(uint *)((long)local_2360.n[0].a[0].limb + uVar11 + 0x14);
      uVar23 = *(uint *)((long)local_2360.n[0].a[0].limb + uVar11 + 0x18);
      uVar25 = *(uint *)((long)local_2360.n[0].a[0].limb + uVar11 + 0x1c);
      uVar19 = *(uint *)((long)local_2360.n[0].b[0].limb + uVar11 + 0x10);
      uVar20 = *(uint *)((long)local_2360.n[0].b[0].limb + uVar11 + 0x14);
      uVar21 = *(uint *)((long)local_2360.n[0].b[0].limb + uVar11 + 0x18);
      uVar3 = *(uint *)((long)local_2360.n[0].b[0].limb + uVar11 + 0x1c);
      uVar22 = (uVar19 ^ uVar4) & uVar7;
      uVar24 = (uVar20 ^ uVar5) & uVar7;
      uVar26 = (uVar21 ^ uVar23) & uVar7;
      uVar27 = (uVar3 ^ uVar25) & uVar7;
      *(uint *)((long)local_2360.n[0].a[0].limb + uVar11 + 0x10) = uVar4 ^ uVar22;
      *(uint *)((long)local_2360.n[0].a[0].limb + uVar11 + 0x14) = uVar5 ^ uVar24;
      *(uint *)((long)local_2360.n[0].a[0].limb + uVar11 + 0x18) = uVar23 ^ uVar26;
      *(uint *)((long)local_2360.n[0].a[0].limb + uVar11 + 0x1c) = uVar25 ^ uVar27;
      *(uint *)((long)local_2360.n[0].b[0].limb + uVar11 + 0x10) = uVar22 ^ uVar19;
      *(uint *)((long)local_2360.n[0].b[0].limb + uVar11 + 0x14) = uVar24 ^ uVar20;
      *(uint *)((long)local_2360.n[0].b[0].limb + uVar11 + 0x18) = uVar26 ^ uVar21;
      *(uint *)((long)local_2360.n[0].b[0].limb + uVar11 + 0x1c) = uVar27 ^ uVar3;
      uVar11 = uVar11 + 0x10;
    } while (uVar11 < 0x21);
    local_23f0 = uVar7;
    uStack_23ec = uVar7;
    uStack_23e8 = uVar7;
    uStack_23e4 = uVar7;
    gf_448_sub(&local_2440,gf_448_ZERO,b_00);
    uVar11 = 0xfffffffffffffff0;
    do {
      uVar6 = *(ulong *)((long)local_2440.limb + uVar11 + 0x18);
      uVar10 = *(ulong *)((long)local_2360.z[0].limb + (uVar11 - 0x28));
      *(ulong *)((long)local_2360.z[0].limb + (uVar11 - 0x30)) =
           *(ulong *)((long)local_2360.z[0].limb + (uVar11 - 0x30)) &
           (CONCAT44(uStack_23ec,local_23f0) ^ 0xffffffffffffffff) |
           *(ulong *)((long)local_2440.limb + uVar11 + 0x10) & CONCAT44(uStack_23ec,local_23f0);
      *(ulong *)((long)local_2360.z[0].limb + (uVar11 - 0x28)) =
           uVar10 & (CONCAT44(uStack_23e4,uStack_23e8) ^ 0xffffffffffffffff) |
           uVar6 & CONCAT44(uStack_23e4,uStack_23e8);
      uVar11 = uVar11 + 0x10;
    } while (uVar11 < 0x21);
    gf_448_mul(&local_2440,local_2260.z,local_2360.z);
    local_2260.z[0].limb[6] = local_2440.limb[6];
    local_2260.z[0].limb[7] = local_2440.limb[7];
    local_2260.z[0].limb[4] = local_2440.limb[4];
    local_2260.z[0].limb[5] = local_2440.limb[5];
    local_2260.z[0].limb[2] = local_2440.limb[2];
    local_2260.z[0].limb[3] = local_2440.limb[3];
    local_2260.z[0].limb[0] = local_2440.limb[0];
    local_2260.z[0].limb[1] = local_2440.limb[1];
    add_niels_to_pt(&local_2260,local_2360.n,0);
    pdVar8 = &local_1060;
    lVar15 = 0;
    uVar19 = uVar17;
    do {
      uVar11 = 0xfffffffffffffff0;
      do {
        puVar1 = (uint *)((long)pdVar8->x[0].limb + uVar11 + 0x10);
        uVar20 = puVar1[1];
        uVar21 = puVar1[2];
        uVar3 = puVar1[3];
        uVar4 = *(uint *)((long)local_2260.x[0].limb + uVar11 + 0x14);
        uVar5 = *(uint *)((long)local_2260.x[0].limb + uVar11 + 0x18);
        uVar23 = *(uint *)((long)local_2260.x[0].limb + uVar11 + 0x1c);
        puVar2 = (uint *)((long)pdVar8->x[0].limb + uVar11 + 0x10);
        *puVar2 = *(uint *)((long)local_2260.x[0].limb + uVar11 + 0x10) & -(uint)(uVar28 == 0) |
                  ~-(uint)(uVar28 == 0) & *puVar1;
        puVar2[1] = uVar4 & -(uint)(uVar16 == 0) | ~-(uint)(uVar16 == 0) & uVar20;
        puVar2[2] = uVar5 & -(uint)(uVar17 == 0) | ~-(uint)(uVar17 == 0) & uVar21;
        puVar2[3] = uVar23 & -(uint)(uVar19 == 0) | ~-(uint)(uVar19 == 0) & uVar3;
        uVar11 = uVar11 + 0x10;
      } while (uVar11 < 0xe1);
      lVar15 = lVar15 + 1;
      uVar28 = uVar28 - 1;
      uVar16 = uVar16 - 1;
      uVar17 = uVar17 - 1;
      uVar19 = uVar19 - 1;
      pdVar8 = pdVar8 + 1;
    } while (lVar15 != 0x10);
    uVar13 = uVar13 ^ uVar18;
    uVar17 = uVar13 & 0xf;
    uVar28 = uVar13 & 0xf;
    uVar13 = uVar13 & 0xf;
    memset(&local_2260,0,0x100);
    pdVar8 = &local_2060;
    lVar15 = 0;
    uVar16 = uVar28;
    uVar19 = uVar13;
    uVar20 = uVar17;
    uVar21 = uVar17;
    do {
      uVar11 = 0xfffffffffffffff0;
      do {
        puVar1 = (uint *)((long)pdVar8->x[0].limb + uVar11 + 0x10);
        uVar23 = puVar1[1];
        uVar25 = puVar1[2];
        uVar22 = puVar1[3];
        uVar3 = *(uint *)((long)local_2260.x[0].limb + uVar11 + 0x14);
        uVar4 = *(uint *)((long)local_2260.x[0].limb + uVar11 + 0x18);
        uVar5 = *(uint *)((long)local_2260.x[0].limb + uVar11 + 0x1c);
        *(uint *)((long)local_2260.x[0].limb + uVar11 + 0x10) =
             *puVar1 & -(uint)(uVar16 == 0) | *(uint *)((long)local_2260.x[0].limb + uVar11 + 0x10);
        *(uint *)((long)local_2260.x[0].limb + uVar11 + 0x14) =
             uVar23 & -(uint)(uVar19 == 0) | uVar3;
        *(uint *)((long)local_2260.x[0].limb + uVar11 + 0x18) =
             uVar25 & -(uint)(uVar20 == 0) | uVar4;
        *(uint *)((long)local_2260.x[0].limb + uVar11 + 0x1c) =
             uVar22 & -(uint)(uVar21 == 0) | uVar5;
        uVar11 = uVar11 + 0x10;
      } while (uVar11 < 0xe1);
      lVar15 = lVar15 + 1;
      uVar16 = uVar16 - 1;
      uVar19 = uVar19 - 1;
      uVar20 = uVar20 - 1;
      uVar21 = uVar21 - 1;
      pdVar8 = pdVar8 + 1;
    } while (lVar15 != 0x10);
    uVar18 = uVar18 ^ uVar7;
    uVar11 = 0xfffffffffffffff0;
    do {
      uVar7 = *(uint *)((long)local_2360.n[0].a[0].limb + uVar11 + 0x10);
      uVar3 = *(uint *)((long)local_2360.n[0].a[0].limb + uVar11 + 0x14);
      uVar4 = *(uint *)((long)local_2360.n[0].a[0].limb + uVar11 + 0x18);
      uVar5 = *(uint *)((long)local_2360.n[0].a[0].limb + uVar11 + 0x1c);
      uVar16 = *(uint *)((long)local_2360.n[0].b[0].limb + uVar11 + 0x10);
      uVar19 = *(uint *)((long)local_2360.n[0].b[0].limb + uVar11 + 0x14);
      uVar20 = *(uint *)((long)local_2360.n[0].b[0].limb + uVar11 + 0x18);
      uVar21 = *(uint *)((long)local_2360.n[0].b[0].limb + uVar11 + 0x1c);
      uVar23 = (uVar16 ^ uVar7) & uVar18;
      uVar25 = (uVar19 ^ uVar3) & uVar18;
      uVar22 = (uVar20 ^ uVar4) & uVar18;
      uVar24 = (uVar21 ^ uVar5) & uVar18;
      *(uint *)((long)local_2360.n[0].a[0].limb + uVar11 + 0x10) = uVar7 ^ uVar23;
      *(uint *)((long)local_2360.n[0].a[0].limb + uVar11 + 0x14) = uVar3 ^ uVar25;
      *(uint *)((long)local_2360.n[0].a[0].limb + uVar11 + 0x18) = uVar4 ^ uVar22;
      *(uint *)((long)local_2360.n[0].a[0].limb + uVar11 + 0x1c) = uVar5 ^ uVar24;
      *(uint *)((long)local_2360.n[0].b[0].limb + uVar11 + 0x10) = uVar23 ^ uVar16;
      *(uint *)((long)local_2360.n[0].b[0].limb + uVar11 + 0x14) = uVar25 ^ uVar19;
      *(uint *)((long)local_2360.n[0].b[0].limb + uVar11 + 0x18) = uVar22 ^ uVar20;
      *(uint *)((long)local_2360.n[0].b[0].limb + uVar11 + 0x1c) = uVar24 ^ uVar21;
      uVar11 = uVar11 + 0x10;
    } while (uVar11 < 0x21);
    local_2470 = CONCAT44(uVar18,uVar18);
    gf_448_sub(&local_2440,gf_448_ZERO,b_00);
    uVar11 = 0xfffffffffffffff0;
    do {
      uVar6 = *(ulong *)((long)local_2440.limb + uVar11 + 0x18);
      uVar10 = *(ulong *)((long)local_2360.z[0].limb + (uVar11 - 0x28));
      *(ulong *)((long)local_2360.z[0].limb + (uVar11 - 0x30)) =
           *(ulong *)((long)local_2360.z[0].limb + (uVar11 - 0x30)) &
           (local_2470 ^ 0xffffffffffffffff) |
           *(ulong *)((long)local_2440.limb + uVar11 + 0x10) & local_2470;
      *(ulong *)((long)local_2360.z[0].limb + (uVar11 - 0x28)) =
           uVar10 & (CONCAT44(uVar18,uVar18) ^ 0xffffffffffffffff) | uVar6 & CONCAT44(uVar18,uVar18)
      ;
      uVar11 = uVar11 + 0x10;
    } while (uVar11 < 0x21);
    gf_448_mul(&local_2440,local_2260.z,local_2360.z);
    local_2260.z[0].limb[6] = local_2440.limb[6];
    local_2260.z[0].limb[7] = local_2440.limb[7];
    local_2260.z[0].limb[4] = local_2440.limb[4];
    local_2260.z[0].limb[5] = local_2440.limb[5];
    local_2260.z[0].limb[2] = local_2440.limb[2];
    local_2260.z[0].limb[3] = local_2440.limb[3];
    local_2260.z[0].limb[0] = local_2440.limb[0];
    local_2260.z[0].limb[1] = local_2440.limb[1];
    add_niels_to_pt(&local_2260,local_2360.n,0);
    pdVar8 = &local_2060;
    lVar15 = 0;
    uVar16 = uVar17;
    do {
      uVar11 = 0xfffffffffffffff0;
      do {
        puVar1 = (uint *)((long)pdVar8->x[0].limb + uVar11 + 0x10);
        uVar18 = puVar1[1];
        uVar19 = puVar1[2];
        uVar20 = puVar1[3];
        uVar21 = *(uint *)((long)local_2260.x[0].limb + uVar11 + 0x14);
        uVar7 = *(uint *)((long)local_2260.x[0].limb + uVar11 + 0x18);
        uVar3 = *(uint *)((long)local_2260.x[0].limb + uVar11 + 0x1c);
        puVar2 = (uint *)((long)pdVar8->x[0].limb + uVar11 + 0x10);
        *puVar2 = -(uint)(uVar28 == 0) & *(uint *)((long)local_2260.x[0].limb + uVar11 + 0x10) |
                  ~-(uint)(uVar28 == 0) & *puVar1;
        puVar2[1] = -(uint)(uVar13 == 0) & uVar21 | ~-(uint)(uVar13 == 0) & uVar18;
        puVar2[2] = -(uint)(uVar17 == 0) & uVar7 | ~-(uint)(uVar17 == 0) & uVar19;
        puVar2[3] = -(uint)(uVar16 == 0) & uVar3 | ~-(uint)(uVar16 == 0) & uVar20;
        uVar11 = uVar11 + 0x10;
      } while (uVar11 < 0xe1);
      lVar15 = lVar15 + 1;
      uVar28 = uVar28 - 1;
      uVar13 = uVar13 - 1;
      uVar17 = uVar17 - 1;
      uVar16 = uVar16 - 1;
      pdVar8 = pdVar8 + 1;
    } while (lVar15 != 0x10);
    uVar11 = (ulong)(uVar14 + 5);
  } while (uVar14 < 0x1b9);
  memcpy(&local_2160,&local_160,0x100);
  memcpy(&local_2260,&dStack_1160,0x100);
  uVar11 = 0x10;
  pdVar8 = &local_160;
  r = &dStack_1160;
  do {
    p = pdVar8 + -1;
    decaf_448_point_add(p,p,pdVar8);
    p_00 = r + -1;
    decaf_448_point_add(p_00,p_00,r);
    decaf_448_point_add(&local_2160,&local_2160,p);
    decaf_448_point_add(&local_2260,&local_2260,p_00);
    uVar11 = uVar11 - 1;
    pdVar8 = p;
    r = p_00;
  } while (2 < uVar11);
  decaf_448_point_add(&local_1060,&local_1060,local_f60);
  decaf_448_point_add(&local_2060,&local_2060,adStack_1f60);
  point_double_internal(&local_2160,&local_2160,0);
  point_double_internal(&local_2260,&local_2260,0);
  decaf_448_point_add(a1,&local_2160,&local_1060);
  decaf_448_point_add(a2,&local_2260,&local_2060);
  decaf_bzero(&local_23a0,0x38);
  decaf_bzero(&local_23e0,0x38);
  decaf_bzero(&local_2360,0x100);
  decaf_bzero(&local_1060,0x1000);
  decaf_bzero(&local_2060,0x1000);
  decaf_bzero(&local_2260,0x100);
  decaf_bzero(&local_2160,0x100);
  return;
}

Assistant:

void API_NS(point_dual_scalarmul) (
    point_t a1,
    point_t a2,
    const point_t b,
    const scalar_t scalar1,
    const scalar_t scalar2
) {
    
    const int WINDOW = DECAF_WINDOW_BITS,
        WINDOW_MASK = (1<<WINDOW)-1,
        WINDOW_T_MASK = WINDOW_MASK >> 1,
        NTABLE = 1<<(WINDOW-1);


    scalar_t scalar1x, scalar2x;
    API_NS(scalar_add)(scalar1x, scalar1, point_scalarmul_adjustment);
    API_NS(scalar_halve)(scalar1x,scalar1x);
    API_NS(scalar_add)(scalar2x, scalar2, point_scalarmul_adjustment);
    API_NS(scalar_halve)(scalar2x,scalar2x);
    
    /* Set up a precomputed table with odd multiples of b. */
    point_t multiples1[1<<((int)(DECAF_WINDOW_BITS)-1)], multiples2[1<<((int)(DECAF_WINDOW_BITS)-1)], working, tmp;
    // Array sizes above equal NTABLE (MSVC compatibility issue)

    pniels_t pn;
    
    API_NS(point_copy)(working, b);

    /* Initialize. */
    int i,j;
    
    for (i=0; i<NTABLE; i++) {
        API_NS(point_copy)(multiples1[i], API_NS(point_identity));
        API_NS(point_copy)(multiples2[i], API_NS(point_identity));
    }

    for (i=0; i<SCALAR_BITS; i+=WINDOW) {   
        if (i) {
            for (j=0; j<WINDOW-1; j++)
                point_double_internal(working, working, -1);
            point_double_internal(working, working, 0);
        }
        
        /* Fetch another block of bits */
        word_t bits1 = scalar1x->limb[i/WBITS] >> (i%WBITS),
               bits2 = scalar2x->limb[i/WBITS] >> (i%WBITS);
        if (i%WBITS >= WBITS-WINDOW && i/WBITS<SCALAR_LIMBS-1) {
            bits1 ^= scalar1x->limb[i/WBITS+1] << (WBITS - (i%WBITS));
            bits2 ^= scalar2x->limb[i/WBITS+1] << (WBITS - (i%WBITS));
        }
        bits1 &= WINDOW_MASK;
        bits2 &= WINDOW_MASK;
        mask_t inv1 = (bits1>>(WINDOW-1))-1;
        mask_t inv2 = (bits2>>(WINDOW-1))-1;
        bits1 ^= inv1;
        bits2 ^= inv2;
        
        pt_to_pniels(pn, working);

        constant_time_lookup(tmp, multiples1, sizeof(tmp), NTABLE, bits1 & WINDOW_T_MASK);
        cond_neg_niels(pn->n, inv1);
        /* add_pniels_to_pt(multiples1[bits1 & WINDOW_T_MASK], pn, 0); */
        add_pniels_to_pt(tmp, pn, 0);
        constant_time_insert(multiples1, tmp, sizeof(tmp), NTABLE, bits1 & WINDOW_T_MASK);
        
        
        constant_time_lookup(tmp, multiples2, sizeof(tmp), NTABLE, bits2 & WINDOW_T_MASK);
        cond_neg_niels(pn->n, inv1^inv2);
        /* add_pniels_to_pt(multiples2[bits2 & WINDOW_T_MASK], pn, 0); */
        add_pniels_to_pt(tmp, pn, 0);
        constant_time_insert(multiples2, tmp, sizeof(tmp), NTABLE, bits2 & WINDOW_T_MASK);
    }
    
    if (NTABLE > 1) {
        API_NS(point_copy)(working, multiples1[NTABLE-1]);
        API_NS(point_copy)(tmp    , multiples2[NTABLE-1]);
    
        for (i=NTABLE-1; i>1; i--) {
            API_NS(point_add)(multiples1[i-1], multiples1[i-1], multiples1[i]);
            API_NS(point_add)(multiples2[i-1], multiples2[i-1], multiples2[i]);
            API_NS(point_add)(working, working, multiples1[i-1]);
            API_NS(point_add)(tmp,     tmp,     multiples2[i-1]);
        }
    
        API_NS(point_add)(multiples1[0], multiples1[0], multiples1[1]);
        API_NS(point_add)(multiples2[0], multiples2[0], multiples2[1]);
        point_double_internal(working, working, 0);
        point_double_internal(tmp,         tmp, 0);
        API_NS(point_add)(a1, working, multiples1[0]);
        API_NS(point_add)(a2, tmp,     multiples2[0]);
    } else {
        API_NS(point_copy)(a1, multiples1[0]);
        API_NS(point_copy)(a2, multiples2[0]);
    }

    decaf_bzero(scalar1x,sizeof(scalar1x));
    decaf_bzero(scalar2x,sizeof(scalar2x));
    decaf_bzero(pn,sizeof(pn));
    decaf_bzero(multiples1,sizeof(multiples1));
    decaf_bzero(multiples2,sizeof(multiples2));
    decaf_bzero(tmp,sizeof(tmp));
    decaf_bzero(working,sizeof(working));
}